

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func_attr.cpp
# Opt level: O3

bool __thiscall mocker::FuncAttr::isPureFunc(FuncAttr *this,FunctionModule *func)

{
  _List_node_base *p_Var1;
  size_t __n;
  int iVar2;
  BasicBlock *pBVar3;
  const_iterator cVar4;
  bool bVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  char cVar9;
  shared_ptr<mocker::ir::Reg> reg;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stackVar;
  long local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  FunctionModule *local_80;
  FuncAttr *local_78;
  _List_node_base *local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_80 = func;
  local_78 = this;
  pBVar3 = ir::FunctionModule::getBasicBlock
                     (func,(size_t)(func->bbs).
                                   super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>
                                   ._M_impl._M_node.super__List_node_base._M_next[1]._M_next);
  p_Var7 = (pBVar3->insts).
           super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var7 != (_List_node_base *)&pBVar3->insts) {
    do {
      p_Var8 = p_Var7[1]._M_next;
      if (*(int *)&p_Var8->_M_prev == 9) {
        p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var7[1]._M_prev;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::_M_emplace<std::__cxx11::string_const&>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&local_68,&(*(_List_node_base **)((long)(p_Var8 + 1) + 8))->_M_prev);
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
        }
      }
      p_Var7 = p_Var7->_M_next;
    } while (p_Var7 != (_List_node_base *)&pBVar3->insts);
  }
  local_70 = (_List_node_base *)&local_80->bbs;
  p_Var7 = (((BasicBlockList *)local_70)->
           super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>).
           _M_impl._M_node.super__List_node_base._M_next;
  bVar5 = true;
  if (p_Var7 != local_70) {
    local_78 = (FuncAttr *)&local_78->pureFuncs;
    do {
      for (p_Var8 = p_Var7[1]._M_prev; p_Var8 != (_List_node_base *)&p_Var7[1]._M_prev;
          p_Var8 = p_Var8->_M_next) {
        p_Var1 = p_Var8[1]._M_next;
        if (*(int *)&p_Var1->_M_prev == 7) {
          p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var8[1]._M_prev;
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            }
          }
          ir::dycLocalReg((ir *)&local_90,(shared_ptr<mocker::ir::Addr> *)(p_Var1 + 1));
          if (local_90 != 0) {
            cVar4 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::find(&local_68,(key_type *)(local_90 + 8));
            if (cVar4.
                super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ._M_cur != (__node_type *)0x0) {
              if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
              }
              if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
              }
              goto LAB_00154555;
            }
          }
LAB_0015466f:
          if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
          }
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
          }
LAB_0015468b:
          bVar5 = false;
          goto LAB_0015468d;
        }
LAB_00154555:
        p_Var1 = p_Var8[1]._M_next;
        if (*(int *)&p_Var1->_M_prev == 8) {
          p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var8[1]._M_prev;
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            }
          }
          ir::dycLocalReg((ir *)&local_90,(shared_ptr<mocker::ir::Addr> *)((long)(p_Var1 + 2) + 8));
          if (local_90 != 0) {
            cVar4 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::find(&local_68,(key_type *)(local_90 + 8));
            if (cVar4.
                super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ._M_cur != (__node_type *)0x0) {
              if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
              }
              if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
              }
              goto LAB_001545ce;
            }
          }
          goto LAB_0015466f;
        }
LAB_001545ce:
        p_Var1 = p_Var8[1]._M_next;
        if (*(int *)&p_Var1->_M_prev == 0xe) {
          p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var8[1]._M_prev;
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            }
          }
          __n = (size_t)p_Var1[3]._M_next;
          if (__n == (local_80->identifier)._M_string_length) {
            cVar9 = '\a';
            if (__n != 0) {
              iVar2 = bcmp((((key_type *)((long)(p_Var1 + 2) + 8U))->_M_dataplus)._M_p,
                           (local_80->identifier)._M_dataplus._M_p,__n);
              if (iVar2 != 0) goto LAB_0015462a;
            }
          }
          else {
LAB_0015462a:
            cVar4 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)local_78,(key_type *)((long)(p_Var1 + 2) + 8U));
            cVar9 = cVar4.
                    super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ._M_cur == (__node_type *)0x0;
          }
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
          }
          if ((cVar9 == '\a') || (cVar9 == '\0')) goto LAB_00154655;
          goto LAB_0015468b;
        }
LAB_00154655:
      }
      p_Var7 = p_Var7->_M_next;
    } while (p_Var7 != local_70);
    bVar5 = true;
  }
LAB_0015468d:
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  return bVar5;
}

Assistant:

bool FuncAttr::isPureFunc(const ir::FunctionModule &func) {
  std::unordered_set<std::string> stackVar;
  for (auto &inst : func.getBasicBlock(func.getFirstBBLabel()).getInsts()) {
    auto alloca = ir::dyc<ir::Alloca>(inst);
    if (!alloca)
      continue;
    stackVar.emplace(alloca->getDest()->getIdentifier());
  }

  for (auto &bb : func.getBBs()) {
    for (auto &inst : bb.getInsts()) {
      if (auto p = ir::dyc<ir::Store>(inst)) {
        auto reg = ir::dycLocalReg(p->getAddr());
        if (!reg || !isIn(stackVar, reg->getIdentifier()))
          return false;
      }
      if (auto p = ir::dyc<ir::Load>(inst)) {
        auto reg = ir::dycLocalReg(p->getAddr());
        if (!reg || !isIn(stackVar, reg->getIdentifier()))
          return false;
      }
      if (auto call = ir::dyc<ir::Call>(inst)) {
        if (call->getFuncName() == func.getIdentifier())
          continue;
        if (!isIn(pureFuncs, call->getFuncName()))
          return false;
      }
    }
  }
  return true;
}